

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::next_chunk
          (ImChunkStream<ImGuiWindowSettings> *this,ImGuiWindowSettings *p)

{
  int iVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiWindowSettings *in_RSI;
  ImChunkStream<ImGuiWindowSettings> *in_RDI;
  bool bVar3;
  size_t HDR_SZ;
  ImGuiWindowSettings *local_8;
  
  pIVar2 = begin(in_RDI);
  bVar3 = false;
  if (pIVar2 <= in_RSI) {
    pIVar2 = end(in_RDI);
    bVar3 = in_RSI < pIVar2;
  }
  if (bVar3) {
    iVar1 = chunk_size(in_RDI,in_RSI);
    local_8 = (ImGuiWindowSettings *)((long)&in_RSI->ID + (long)iVar1);
    pIVar2 = end(in_RDI);
    if (local_8 == (ImGuiWindowSettings *)&pIVar2->Pos) {
      local_8 = (ImGuiWindowSettings *)0x0;
    }
    else {
      pIVar2 = end(in_RDI);
      if (pIVar2 <= local_8) {
        __assert_fail("p < end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                      ,0x25f,
                      "T *ImChunkStream<ImGuiWindowSettings>::next_chunk(T *) [T = ImGuiWindowSettings]"
                     );
      }
    }
    return local_8;
  }
  __assert_fail("p >= begin() && p < end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                ,0x25f,
                "T *ImChunkStream<ImGuiWindowSettings>::next_chunk(T *) [T = ImGuiWindowSettings]");
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }